

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall
kratos::AssignStmt::AssignStmt
          (AssignStmt *this,shared_ptr<kratos::Var> *left,shared_ptr<kratos::Var> *right)

{
  shared_ptr<kratos::Var> local_30;
  shared_ptr<kratos::Var> *local_20;
  shared_ptr<kratos::Var> *right_local;
  shared_ptr<kratos::Var> *left_local;
  AssignStmt *this_local;
  
  local_20 = right;
  right_local = left;
  left_local = (shared_ptr<kratos::Var> *)this;
  std::shared_ptr<kratos::Var>::shared_ptr(&local_30,right);
  AssignStmt(this,left,&local_30,Undefined);
  std::shared_ptr<kratos::Var>::~shared_ptr(&local_30);
  return;
}

Assistant:

AssignStmt::AssignStmt(const std::shared_ptr<Var> &left, const std::shared_ptr<Var> &right)
    : AssignStmt(left, right, AssignmentType::Undefined) {}